

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apngasm.cpp
# Opt level: O3

size_t __thiscall apngasm::APNGAsm::addFrame(APNGAsm *this,APNGFrame *frame)

{
  pointer *ppAVar1;
  iterator __position;
  char cVar2;
  
  cVar2 = (**(code **)(*(long *)this->_listener + 0x18))();
  if (cVar2 != '\0') {
    __position._M_current =
         (this->_frames).super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->_frames).super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<apngasm::APNGFrame,std::allocator<apngasm::APNGFrame>>::
      _M_realloc_insert<apngasm::APNGFrame_const&>
                ((vector<apngasm::APNGFrame,std::allocator<apngasm::APNGFrame>> *)this,__position,
                 frame);
    }
    else {
      memcpy(__position._M_current,frame,0x430);
      ppAVar1 = &(this->_frames).
                 super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>._M_impl
                 .super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + 1;
    }
    (**(code **)(*(long *)this->_listener + 0x28))(this->_listener,frame);
  }
  return ((long)(this->_frames).
                super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->_frames).
                super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>._M_impl.
                super__Vector_impl_data._M_start >> 4) * -0xf4898d5f85bb395;
}

Assistant:

size_t APNGAsm::addFrame(const APNGFrame &frame)
  {
    if( _listener->onPreAddFrame(frame) )
    {
      _frames.push_back(frame);
      _listener->onPostAddFrame(frame);
    }
    return _frames.size();
  }